

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_avm(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_INT RVar1;
  REF_CELL pRVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  double local_678;
  REF_LONG ref_private_status_reis_bi_61;
  REF_LONG ref_private_status_reis_ai_61;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_BOOL sixty_four_bit;
  REF_BOOL swap_endian_1;
  REF_FILEPOS faceid_offset;
  REF_FILEPOS conn_offset;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_INT temp_node;
  REF_INT cell_2;
  REF_BOOL pad_2;
  REF_INT version_3;
  REF_CELL ref_cell_2;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_BOOL pad_1;
  REF_INT cell_1;
  REF_INT version_2;
  REF_CELL ref_cell_1;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_BOOL pad;
  REF_INT cell;
  REF_INT version_1;
  REF_CELL ref_cell;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_BOOL twod;
  REF_INT version;
  REF_BOOL swap_endian;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_60;
  REF_LONG ref_private_status_reis_ai_60;
  REF_LONG ref_private_status_reis_bi_59;
  REF_LONG ref_private_status_reis_ai_59;
  REF_LONG ref_private_status_reis_bi_58;
  REF_LONG ref_private_status_reis_ai_58;
  REF_LONG ref_private_status_reis_bi_57;
  REF_LONG ref_private_status_reis_ai_57;
  REF_LONG ref_private_status_reis_bi_56;
  REF_LONG ref_private_status_reis_ai_56;
  REF_LONG ref_private_status_reis_bi_55;
  REF_LONG ref_private_status_reis_ai_55;
  REF_LONG ref_private_status_reis_bi_54;
  REF_LONG ref_private_status_reis_ai_54;
  REF_LONG ref_private_status_reis_bi_53;
  REF_LONG ref_private_status_reis_ai_53;
  REF_LONG ref_private_status_reis_bi_52;
  REF_LONG ref_private_status_reis_ai_52;
  REF_LONG ref_private_status_reis_bi_51;
  REF_LONG ref_private_status_reis_ai_51;
  REF_LONG ref_private_status_reis_bi_50;
  REF_LONG ref_private_status_reis_ai_50;
  REF_LONG ref_private_status_reis_bi_49;
  REF_LONG ref_private_status_reis_ai_49;
  REF_LONG ref_private_status_reis_bi_48;
  REF_LONG ref_private_status_reis_ai_48;
  REF_LONG ref_private_status_reis_bi_47;
  REF_LONG ref_private_status_reis_ai_47;
  REF_LONG ref_private_status_reis_bi_46;
  REF_LONG ref_private_status_reis_ai_46;
  REF_LONG ref_private_status_reis_bi_45;
  REF_LONG ref_private_status_reis_ai_45;
  REF_LONG ref_private_status_reis_bi_44;
  REF_LONG ref_private_status_reis_ai_44;
  REF_LONG ref_private_status_reis_bi_43;
  REF_LONG ref_private_status_reis_ai_43;
  REF_LONG ref_private_status_reis_bi_42;
  REF_LONG ref_private_status_reis_ai_42;
  REF_LONG ref_private_status_reis_bi_41;
  REF_LONG ref_private_status_reis_ai_41;
  REF_LONG ref_private_status_reis_bi_40;
  REF_LONG ref_private_status_reis_ai_40;
  REF_LONG ref_private_status_reis_bi_39;
  REF_LONG ref_private_status_reis_ai_39;
  REF_LONG ref_private_status_reis_bi_38;
  REF_LONG ref_private_status_reis_ai_38;
  REF_LONG ref_private_status_reis_bi_37;
  REF_LONG ref_private_status_reis_ai_37;
  REF_LONG ref_private_status_reis_bi_36;
  REF_LONG ref_private_status_reis_ai_36;
  REF_LONG ref_private_status_reis_bi_35;
  REF_LONG ref_private_status_reis_ai_35;
  REF_LONG ref_private_status_reis_bi_34;
  REF_LONG ref_private_status_reis_ai_34;
  REF_LONG ref_private_status_reis_bi_33;
  REF_LONG ref_private_status_reis_ai_33;
  REF_LONG ref_private_status_reis_bi_32;
  REF_LONG ref_private_status_reis_ai_32;
  REF_LONG ref_private_status_reis_bi_31;
  REF_LONG ref_private_status_reis_ai_31;
  REF_LONG ref_private_status_reis_bi_30;
  REF_LONG ref_private_status_reis_ai_30;
  REF_LONG ref_private_status_reis_bi_29;
  REF_LONG ref_private_status_reis_ai_29;
  REF_LONG ref_private_status_reis_bi_28;
  REF_LONG ref_private_status_reis_ai_28;
  REF_LONG ref_private_status_reis_bi_27;
  REF_LONG ref_private_status_reis_ai_27;
  REF_LONG ref_private_status_reis_bi_26;
  REF_LONG ref_private_status_reis_ai_26;
  REF_LONG ref_private_status_reis_bi_25;
  REF_LONG ref_private_status_reis_ai_25;
  REF_LONG ref_private_status_reis_bi_24;
  REF_LONG ref_private_status_reis_ai_24;
  REF_LONG ref_private_status_reis_bi_23;
  REF_LONG ref_private_status_reis_ai_23;
  REF_LONG ref_private_status_reis_bi_22;
  REF_LONG ref_private_status_reis_ai_22;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_21;
  REF_LONG ref_private_status_reis_ai_21;
  REF_DBL ref_private_status_rwds_allowed;
  REF_DBL ref_private_status_rwds_del;
  REF_DBL ref_private_status_rwds_bd;
  REF_DBL ref_private_status_rwds_ad;
  REF_LONG ref_private_status_reis_bi_20;
  REF_LONG ref_private_status_reis_ai_20;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  undefined1 local_1b8 [4];
  int patch_id;
  char patch_type [17];
  undefined1 local_198 [8];
  char patch_label [33];
  int local_168 [2];
  int zeros [5];
  int nqua2;
  int nqua;
  int ntri2;
  int ntri_int;
  int npyr;
  int npri;
  int nhex;
  int ntet_int;
  int boundary_patches;
  int cell_polynomial_order;
  int face_polynomial_order;
  char element_scheme [33];
  int max_faces_per_cell;
  int max_nodes_per_cell;
  int max_nodes_per_face;
  int ncells;
  int nfaces;
  int nnodes;
  int refined;
  double reference [7];
  char local_a3 [2];
  undefined1 local_a1;
  double dStack_a0;
  char units [3];
  double model_scale;
  undefined1 local_8e;
  char local_8d;
  char coordinate_system [7];
  char mesh_type [8];
  char letter;
  int precision;
  int meshes;
  int revision;
  int magic;
  int length;
  int i;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ntri;
  REF_LONG ntet;
  REF_LONG nnode;
  FILE *pFStack_48;
  REF_INT dim;
  FILE *file;
  REF_NODE pRStack_38;
  REF_BOOL verbose;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  file._4_4_ = 1;
  ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  length = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (length != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x5ed,
           "ref_part_avm",(ulong)(uint)length,"create grid");
    return length;
  }
  ref_node = *(REF_NODE *)ref_mpi_local;
  pRStack_38 = *(REF_NODE *)&ref_node->blank;
  pFStack_48 = (FILE *)0x0;
  if (*(int *)(filename_local + 4) == 0) {
    pFStack_48 = fopen((char *)ref_grid,"r");
    if (pFStack_48 == (FILE *)0x0) {
      printf("unable to open %s\n",ref_grid);
    }
    if (pFStack_48 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x60c,
             "ref_part_avm","unable to open file");
      return 2;
    }
    revision = 6;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x60f,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    sVar5 = fread(&meshes,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x613,
             "ref_part_avm","magic",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d magic\n",(ulong)(uint)meshes);
    }
    if ((long)meshes != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x615,
             "ref_part_avm","magic",1,(long)meshes);
      return 1;
    }
    sVar5 = fread(&precision,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x616,
             "ref_part_avm","revision",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d revision\n",(ulong)(uint)precision);
    }
    if ((long)precision != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x618,
             "ref_part_avm","revision",2,(long)precision);
      return 1;
    }
    sVar5 = fread(mesh_type + 5,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x619,
             "ref_part_avm","meshes",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d meshes\n",(ulong)stack0xffffffffffffff80);
    }
    if ((long)(int)stack0xffffffffffffff80 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x61b,
             "ref_part_avm","meshes",1,(long)(int)stack0xffffffffffffff80);
      return 1;
    }
    revision = 0x80;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x61e,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    sVar5 = fread(mesh_type + 1,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x622,
             "ref_part_avm","precision",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d precision\n",(ulong)(uint)mesh_type._1_4_);
    }
    if ((long)(int)mesh_type._1_4_ != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x624,
             "ref_part_avm","precision",2,(long)(int)mesh_type._1_4_);
      return 1;
    }
    sVar5 = fread((void *)((long)&nnode + 4),4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x625,
             "ref_part_avm","dim",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d dim\n",(ulong)nnode._4_4_);
    }
    if (((int)nnode._4_4_ < 2) || (3 < (int)nnode._4_4_)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x627,
             "ref_part_avm","dim");
      return 1;
    }
    sVar5 = fread(&revision,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x628,
             "ref_part_avm","length",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d description length\n",(ulong)(uint)revision);
    }
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x62b,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    revision = 0x80;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x632,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    sVar5 = fread(&local_8d,1,7,pFStack_48);
    if (sVar5 != 7) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x636,
             "ref_part_avm","letter",7,sVar5);
      return 1;
    }
    coordinate_system[6] = '\0';
    if (file._4_4_ != 0) {
      printf("%s",&local_8d);
    }
    iVar3 = strcmp("unstruc",&local_8d);
    if ((long)iVar3 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x639,
             "ref_part_avm","mesh type",0,(long)iVar3);
      return 1;
    }
    revision = 0x79;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x63c,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    revision = 0x80;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x643,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    sVar5 = fread((void *)((long)&model_scale + 4),1,6,pFStack_48);
    if (sVar5 != 6) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x648,
             "ref_part_avm","coordinate_system",6,sVar5);
      return 1;
    }
    local_8e = 0;
    if (file._4_4_ != 0) {
      printf("%s",(long)&model_scale + 4);
    }
    uVar4 = ref_grid_parse_coordinate_system((REF_GRID)ref_node,(char *)((long)&model_scale + 4));
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x64c,
             "ref_part_avm",(ulong)uVar4,"parse coordinate_system");
      return uVar4;
    }
    revision = 0x7a;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x64f,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    sVar5 = fread(&stack0xffffffffffffff60,8,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x653,
             "ref_part_avm","model_scale",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%f model_scale\n",dStack_a0);
    }
    if (1.0 - dStack_a0 <= 0.0) {
      local_678 = -(1.0 - dStack_a0);
    }
    else {
      local_678 = 1.0 - dStack_a0;
    }
    if (1e-12 < local_678) {
      printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",0x3ff0000000000000,
             dStack_a0,local_678,0x3d719799812dea11,
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x655,
             "ref_part_avm","model_scale");
      return 1;
    }
    sVar5 = fread(local_a3,1,2,pFStack_48);
    if (sVar5 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x656,
             "ref_part_avm","units",2,sVar5);
      return 1;
    }
    local_a1 = 0;
    if (file._4_4_ != 0) {
      printf("%s",local_a3);
    }
    uVar4 = ref_grid_parse_unit((REF_GRID)ref_node,local_a3);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x659,
             "ref_part_avm",(ulong)uVar4,"parse unit");
      return uVar4;
    }
    revision = 0x7e;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x65c,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    sVar5 = fread(&nnodes,8,7,pFStack_48);
    if (sVar5 != 7) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x660,
             "ref_part_avm","letter",7,sVar5);
      return 1;
    }
    for (magic = 0; magic < 7; magic = magic + 1) {
      (&ref_node[1].age)[magic] = *(REF_INT **)(&nnodes + (long)magic * 2);
      if (file._4_4_ != 0) {
        printf("%f reference %d\n",*(undefined8 *)(&nnodes + (long)magic * 2),(ulong)(uint)magic);
      }
    }
    revision = 0x80;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x668,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    sVar5 = fread(&nfaces,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x66c,
             "ref_part_avm","refined",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d refined\n",(ulong)(uint)nfaces);
    }
    if ((long)nfaces != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x66e,
             "ref_part_avm","refined",0,(long)nfaces);
      return 1;
    }
    revision = 0x80;
    for (magic = 0; magic < revision; magic = magic + 1) {
      sVar5 = fread(mesh_type,1,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x672,"ref_part_avm","letter",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%c",(ulong)(uint)(int)mesh_type[0]);
      }
    }
    if (file._4_4_ != 0) {
      printf("\n");
    }
    sVar5 = fread(&ncells,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x676,
             "ref_part_avm","nnodes",1,sVar5);
      return 1;
    }
    sVar5 = fread(&max_nodes_per_face,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x677,
             "ref_part_avm","nfaces",1,sVar5);
      return 1;
    }
    sVar5 = fread(&max_nodes_per_cell,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x678,
             "ref_part_avm","ncells",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d nnodes %d nfaces %d ncells\n",(ulong)(uint)ncells,(ulong)(uint)max_nodes_per_face,
             (ulong)(uint)max_nodes_per_cell);
    }
    sVar5 = fread(&max_faces_per_cell,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x67c,
             "ref_part_avm","max_nodes_per_face",1,sVar5);
      return 1;
    }
    sVar5 = fread(element_scheme + 0x20,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x67e,
             "ref_part_avm","max_nodes_per_cell",1,sVar5);
      return 1;
    }
    sVar5 = fread(element_scheme + 0x1c,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x680,
             "ref_part_avm","max_faces_per_cell",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d max_nodes_per_face %d max_faces_per_face %d max_faces_per_cell\n",
             (ulong)(uint)max_faces_per_cell,(ulong)stack0xffffffffffffff00,
             (ulong)(uint)element_scheme._28_4_);
    }
    sVar5 = fread(&cell_polynomial_order,1,0x20,pFStack_48);
    if (sVar5 != 0x20) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x685,
             "ref_part_avm","element_scheme",0x20,sVar5);
      return 1;
    }
    element_scheme[0x18] = '\0';
    if (file._4_4_ != 0) {
      printf("%s\n",&cell_polynomial_order);
    }
    iVar3 = strcmp("uniform",(char *)&cell_polynomial_order);
    if ((long)iVar3 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x688,
             "ref_part_avm","element_scheme",0,(long)iVar3);
      return 1;
    }
    sVar5 = fread(&boundary_patches,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x68b,
             "ref_part_avm","face_polynomial_order",1,sVar5);
      return 1;
    }
    sVar5 = fread(&ntet_int,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x68e,
             "ref_part_avm","cell_polynomial_order",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d face_polynomial_order %d cell_polynomial_order\n",(ulong)(uint)boundary_patches,
             (ulong)(uint)ntet_int);
    }
    if ((long)boundary_patches != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x692,
             "ref_part_avm","face_polynomial_order",1,(long)boundary_patches);
      return 1;
    }
    if ((long)ntet_int != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x693,
             "ref_part_avm","cell_polynomial_order",1,(long)ntet_int);
      return 1;
    }
    sVar5 = fread(&nhex,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x695,
             "ref_part_avm","boundary_patches",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d boundary_patches\n",(ulong)(uint)nhex);
    }
    sVar5 = fread(&npyr,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x697,
             "ref_part_avm","nhex",1,sVar5);
      return 1;
    }
    sVar5 = fread(&npri,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x698,
             "ref_part_avm","ntet_int",1,sVar5);
      return 1;
    }
    ntri = (REF_LONG)npri;
    sVar5 = fread(&ntri_int,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x69a,
             "ref_part_avm","npri",1,sVar5);
      return 1;
    }
    sVar5 = fread(&ntri2,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x69b,
             "ref_part_avm","npyr",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d nhex %d ntet %d npri %d npyr\n",(ulong)(uint)npyr,(ulong)(uint)npri,
             (ulong)(uint)ntri_int,(ulong)(uint)ntri2);
    }
    if ((long)npyr != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x69e,
             "ref_part_avm","cant do hex",0,(long)npyr);
      return 1;
    }
    if ((long)ntri_int != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x69f,
             "ref_part_avm","cant do prism",0,(long)ntri_int);
      return 1;
    }
    if ((long)ntri2 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6a0,
             "ref_part_avm","cant do pyramid",0,(long)ntri2);
      return 1;
    }
    if ((long)max_nodes_per_cell != (long)npri) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6a1,
             "ref_part_avm","ncells does not match ntet",(long)max_nodes_per_cell,(long)npri);
      return 1;
    }
    sVar5 = fread(&nqua,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6a2,
             "ref_part_avm","ntri_int",1,sVar5);
      return 1;
    }
    _i = (long)nqua;
    sVar5 = fread(&nqua2,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6a4,
             "ref_part_avm","ntri2",1,sVar5);
      return 1;
    }
    sVar5 = fread(zeros + 4,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6a5,
             "ref_part_avm","nqua",1,sVar5);
      return 1;
    }
    sVar5 = fread(zeros + 3,4,1,pFStack_48);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6a6,
             "ref_part_avm","nqua2",1,sVar5);
      return 1;
    }
    if (file._4_4_ != 0) {
      printf("%d ntri %d ntri %d nqua %d nqua\n",(ulong)(uint)nqua,(ulong)(uint)nqua2,
             (ulong)(uint)zeros[4],(ulong)(uint)zeros[3]);
    }
    if (_i != nqua2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6a9,
             "ref_part_avm","ntri mismatch",_i,(long)nqua2);
      return 1;
    }
    if ((long)zeros[4] != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6aa,
             "ref_part_avm","cant do quad",0,(long)zeros[4]);
      return 1;
    }
    if ((long)zeros[4] != (long)zeros[3]) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6ab,
             "ref_part_avm","nquad mismatch",(long)zeros[4],(long)zeros[3]);
      return 1;
    }
    sVar5 = fread(local_168,4,5,pFStack_48);
    if (sVar5 != 5) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6ac,
             "ref_part_avm","zeros",5,sVar5);
      return 1;
    }
    for (magic = 0; magic < 5; magic = magic + 1) {
      if ((long)local_168[magic] != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x6ae,"ref_part_avm","zeros not zero",0,(long)local_168[magic]);
        return 1;
      }
    }
    for (magic = 0; magic < nhex; magic = magic + 1) {
      sVar5 = fread(local_198,1,0x20,pFStack_48);
      if (sVar5 != 0x20) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x6b1,"ref_part_avm","patch_label",0x20,sVar5);
        return 1;
      }
      patch_label[0x18] = '\0';
      sVar5 = fread(local_1b8,1,0x10,pFStack_48);
      if (sVar5 != 0x10) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x6b3,"ref_part_avm","patch_type",0x10,sVar5);
        return 1;
      }
      patch_type[8] = '\0';
      sVar5 = fread((void *)((long)&ref_private_status_reis_ai + 4),4,1,pFStack_48);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x6b5,"ref_part_avm","patch_id",1,sVar5);
        return 1;
      }
      if (file._4_4_ != 0) {
        printf("%s %s %d -> %d\n",local_198,local_1b8,(ulong)ref_private_status_reis_ai._4_4_,
               (ulong)-ref_private_status_reis_ai._4_4_);
      }
    }
    ntet = (REF_LONG)ncells;
  }
  uVar4 = ref_mpi_bcast(*(REF_MPI *)ref_node,(void *)((long)&nnode + 4),1,1);
  if (uVar4 == 0) {
    *(uint *)&ref_node[1].old_n_global = (uint)(nnode._4_4_ == 2);
    uVar4 = ref_mpi_bcast(*(REF_MPI *)ref_node,&ref_node[1].part,1,1);
    if (uVar4 == 0) {
      uVar4 = ref_mpi_bcast(*(REF_MPI *)ref_node,(void *)((long)&ref_node[1].part + 4),1,1);
      if (uVar4 == 0) {
        uVar4 = ref_mpi_bcast(*(REF_MPI *)ref_node,&ref_node[1].age,7,3);
        if (uVar4 == 0) {
          uVar4 = ref_mpi_bcast(*(REF_MPI *)ref_node,&ntet,1,2);
          if (uVar4 == 0) {
            uVar4 = ref_mpi_bcast(*(REF_MPI *)ref_node,&i,1,2);
            if (uVar4 == 0) {
              uVar4 = ref_mpi_bcast(*(REF_MPI *)ref_node,&ntri,1,2);
              if (uVar4 == 0) {
                uVar4 = ref_part_node((FILE *)pFStack_48,0,0,0,pRStack_38,ntet);
                if (uVar4 == 0) {
                  if ((int)ref_node[1].old_n_global == 0) {
                    pRVar2 = (REF_CELL)ref_node->part;
                    uVar4 = ref_part_meshb_cell(pRVar2,_i,pRStack_38,ntet,0,0,(FILE *)pFStack_48);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x6e9,"ref_part_avm",(ulong)uVar4,"read tri");
                      return uVar4;
                    }
                    for (ref_private_macro_code_rss_12 = 0;
                        ref_private_macro_code_rss_12 < pRVar2->max;
                        ref_private_macro_code_rss_12 = ref_private_macro_code_rss_12 + 1) {
                      if (((-1 < ref_private_macro_code_rss_12) &&
                          (ref_private_macro_code_rss_12 < pRVar2->max)) &&
                         (pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_12] != -1)) {
                        pRVar2->c2n
                        [pRVar2->node_per + pRVar2->size_per * ref_private_macro_code_rss_12] =
                             -pRVar2->c2n
                              [pRVar2->node_per + pRVar2->size_per * ref_private_macro_code_rss_12];
                      }
                    }
                  }
                  else {
                    pRVar2 = (REF_CELL)ref_node->global;
                    uVar4 = ref_part_meshb_cell(pRVar2,_i,pRStack_38,ntet,0,1,(FILE *)pFStack_48);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x6dc,"ref_part_avm",(ulong)uVar4,"read edg as tri");
                      return uVar4;
                    }
                    for (ref_private_macro_code_rss_11 = 0;
                        ref_private_macro_code_rss_11 < pRVar2->max;
                        ref_private_macro_code_rss_11 = ref_private_macro_code_rss_11 + 1) {
                      if (((-1 < ref_private_macro_code_rss_11) &&
                          (ref_private_macro_code_rss_11 < pRVar2->max)) &&
                         (pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11] != -1)) {
                        pRVar2->c2n
                        [pRVar2->node_per + pRVar2->size_per * ref_private_macro_code_rss_11] =
                             -pRVar2->c2n
                              [pRVar2->node_per + pRVar2->size_per * ref_private_macro_code_rss_11];
                      }
                    }
                  }
                  if ((int)ref_node[1].old_n_global == 0) {
                    faceid_offset = 0;
                    if (*(int *)(*(long *)ref_node + 4) == 0) {
                      faceid_offset = ftello(pFStack_48);
                    }
                    uVar4 = ref_part_bin_ugrid_cell
                                      ((REF_CELL)ref_node->ref_mpi,ntri,pRStack_38,ntet,
                                       (FILE *)pFStack_48,faceid_offset,0,0,0);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x709,"ref_part_avm",(ulong)uVar4,"read tet");
                      return uVar4;
                    }
                  }
                  else {
                    pRVar2 = (REF_CELL)ref_node->part;
                    uVar4 = ref_part_meshb_cell(pRVar2,ntri,pRStack_38,ntet,0,0,(FILE *)pFStack_48);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x6f8,"ref_part_avm",(ulong)uVar4,"read tri");
                      return uVar4;
                    }
                    for (ref_private_macro_code_rss_13 = 0;
                        ref_private_macro_code_rss_13 < pRVar2->max;
                        ref_private_macro_code_rss_13 = ref_private_macro_code_rss_13 + 1) {
                      if (((-1 < ref_private_macro_code_rss_13) &&
                          (ref_private_macro_code_rss_13 < pRVar2->max)) &&
                         (pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_13] != -1)) {
                        RVar1 = pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_13 + 2];
                        pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_13 + 2] =
                             pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_13 + 1];
                        pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_13 + 1] = RVar1;
                      }
                    }
                  }
                  if (*(int *)(*(long *)ref_node + 4) == 0) {
                    iVar3 = fclose(pFStack_48);
                    if ((long)iVar3 != 0) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x70c,"ref_part_avm","close file",0,(long)iVar3);
                      return 1;
                    }
                  }
                  ref_grid_ptr_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x6d2,"ref_part_avm",(ulong)uVar4,"part node");
                  ref_grid_ptr_local._4_4_ = uVar4;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x6cb,"ref_part_avm",(ulong)uVar4,"bcast");
                ref_grid_ptr_local._4_4_ = uVar4;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x6ca,"ref_part_avm",(ulong)uVar4,"bcast");
              ref_grid_ptr_local._4_4_ = uVar4;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x6c9,"ref_part_avm",(ulong)uVar4,"bcast");
            ref_grid_ptr_local._4_4_ = uVar4;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x6c7,"ref_part_avm",(ulong)uVar4,"reference");
          ref_grid_ptr_local._4_4_ = uVar4;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x6c4,"ref_part_avm",(ulong)uVar4,"unit");
        ref_grid_ptr_local._4_4_ = uVar4;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6c1,
             "ref_part_avm",(ulong)uVar4,"coordinate_system");
      ref_grid_ptr_local._4_4_ = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x6bc,
           "ref_part_avm",(ulong)uVar4,"dim");
    ref_grid_ptr_local._4_4_ = uVar4;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_avm(REF_GRID *ref_grid_ptr, REF_MPI ref_mpi,
                                       const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_BOOL verbose = REF_TRUE;
  FILE *file;
  REF_INT dim;
  REF_LONG nnode;
  REF_LONG ntet;
  REF_LONG ntri;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    int i, length, magic, revision, meshes, precision;
    char letter;
    char mesh_type[8];
    char coordinate_system[7];
    double model_scale;
    char units[3];
    double reference[7];
    int refined;
    int nnodes, nfaces, ncells;
    int max_nodes_per_face;
    int max_nodes_per_cell;
    int max_faces_per_cell;
    char element_scheme[33];
    int face_polynomial_order;
    int cell_polynomial_order;
    int boundary_patches;
    int ntet_int, nhex, npri, npyr;
    int ntri_int, ntri2, nqua, nqua2;
    int zeros[5];
    char patch_label[33];
    char patch_type[17];
    int patch_id;

    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    length = 6;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(1, fread(&magic, sizeof(magic), 1, file), "magic");
    if (verbose) printf("%d magic\n", magic);
    REIS(1, magic, "magic");
    REIS(1, fread(&revision, sizeof(revision), 1, file), "revision");
    if (verbose) printf("%d revision\n", revision);
    REIS(2, revision, "revision");
    REIS(1, fread(&meshes, sizeof(meshes), 1, file), "meshes");
    if (verbose) printf("%d meshes\n", meshes);
    REIS(1, meshes, "meshes");
    length = 128;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(1, fread(&precision, sizeof(precision), 1, file), "precision");
    if (verbose) printf("%d precision\n", precision);
    REIS(2, precision, "precision");
    REIS(1, fread(&dim, sizeof(dim), 1, file), "dim");
    if (verbose) printf("%d dim\n", dim);
    RAS(2 <= dim && dim <= 3, "dim");
    REIS(1, fread(&length, sizeof(length), 1, file), "length");
    if (verbose) printf("%d description length\n", length);
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    /* mesh name */
    length = 128;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(7, fread(mesh_type, sizeof(char), 7, file), "letter");
    mesh_type[7] = '\0';
    if (verbose) printf("%s", mesh_type);
    REIS(0, strcmp("unstruc", mesh_type), "mesh type");
    length = 128 - 7;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    /* mesh generator */
    length = 128;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(6, fread(coordinate_system, sizeof(char), 6, file),
         "coordinate_system");
    coordinate_system[6] = '\0';
    if (verbose) printf("%s", coordinate_system);
    RSS(ref_grid_parse_coordinate_system(ref_grid, coordinate_system),
        "parse coordinate_system");
    length = 128 - 6;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(1, fread(&model_scale, sizeof(model_scale), 1, file), "model_scale");
    if (verbose) printf("%f model_scale\n", model_scale);
    RWDS(1, model_scale, -1, "model_scale");
    REIS(2, fread(units, sizeof(char), 2, file), "units");
    units[2] = '\0';
    if (verbose) printf("%s", units);
    RSS(ref_grid_parse_unit(ref_grid, units), "parse unit");
    length = 128 - 2;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(7, fread(reference, sizeof(double), 7, file), "letter");
    for (i = 0; i < 7; i++) {
      ref_grid_reference(ref_grid, i) = reference[i];
      if (verbose) printf("%f reference %d\n", reference[i], i);
    }
    /* reference point description */
    length = 128;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(1, fread(&refined, sizeof(refined), 1, file), "refined");
    if (verbose) printf("%d refined\n", refined);
    REIS(0, refined, "refined");
    /* mesh description */
    length = 128;
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "letter");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(1, fread(&nnodes, sizeof(nnodes), 1, file), "nnodes");
    REIS(1, fread(&nfaces, sizeof(nfaces), 1, file), "nfaces");
    REIS(1, fread(&ncells, sizeof(ncells), 1, file), "ncells");
    if (verbose)
      printf("%d nnodes %d nfaces %d ncells\n", nnodes, nfaces, ncells);
    REIS(1, fread(&max_nodes_per_face, sizeof(max_nodes_per_face), 1, file),
         "max_nodes_per_face");
    REIS(1, fread(&max_nodes_per_cell, sizeof(max_nodes_per_cell), 1, file),
         "max_nodes_per_cell");
    REIS(1, fread(&max_faces_per_cell, sizeof(max_faces_per_cell), 1, file),
         "max_faces_per_cell");
    if (verbose)
      printf(
          "%d max_nodes_per_face %d max_faces_per_face %d max_faces_per_cell\n",
          max_nodes_per_face, max_nodes_per_cell, max_faces_per_cell);
    REIS(32, fread(element_scheme, sizeof(char), 32, file), "element_scheme");
    element_scheme[32] = '\0';
    if (verbose) printf("%s\n", element_scheme);
    REIS(0, strcmp("uniform", element_scheme), "element_scheme");
    REIS(1,
         fread(&face_polynomial_order, sizeof(face_polynomial_order), 1, file),
         "face_polynomial_order");
    REIS(1,
         fread(&cell_polynomial_order, sizeof(cell_polynomial_order), 1, file),
         "cell_polynomial_order");
    if (verbose)
      printf("%d face_polynomial_order %d cell_polynomial_order\n",
             face_polynomial_order, cell_polynomial_order);
    REIS(1, face_polynomial_order, "face_polynomial_order");
    REIS(1, cell_polynomial_order, "cell_polynomial_order");
    REIS(1, fread(&boundary_patches, sizeof(boundary_patches), 1, file),
         "boundary_patches");
    if (verbose) printf("%d boundary_patches\n", boundary_patches);
    REIS(1, fread(&nhex, sizeof(nhex), 1, file), "nhex");
    REIS(1, fread(&ntet_int, sizeof(ntet_int), 1, file), "ntet_int");
    ntet = (REF_LONG)ntet_int;
    REIS(1, fread(&npri, sizeof(npri), 1, file), "npri");
    REIS(1, fread(&npyr, sizeof(npyr), 1, file), "npyr");
    if (verbose)
      printf("%d nhex %d ntet %d npri %d npyr\n", nhex, ntet_int, npri, npyr);
    REIS(0, nhex, "cant do hex");
    REIS(0, npri, "cant do prism");
    REIS(0, npyr, "cant do pyramid");
    REIS(ncells, ntet_int, "ncells does not match ntet");
    REIS(1, fread(&ntri_int, sizeof(ntri_int), 1, file), "ntri_int");
    ntri = (REF_LONG)ntri_int;
    REIS(1, fread(&ntri2, sizeof(ntri2), 1, file), "ntri2");
    REIS(1, fread(&nqua, sizeof(nqua), 1, file), "nqua");
    REIS(1, fread(&nqua2, sizeof(nqua2), 1, file), "nqua2");
    if (verbose)
      printf("%d ntri %d ntri %d nqua %d nqua\n", ntri_int, ntri2, nqua, nqua2);
    REIS(ntri, ntri2, "ntri mismatch");
    REIS(0, nqua, "cant do quad");
    REIS(nqua, nqua2, "nquad mismatch");
    REIS(5, fread(zeros, sizeof(int), 5, file), "zeros");
    for (i = 0; i < 5; i++) {
      REIS(0, zeros[i], "zeros not zero");
    }
    for (i = 0; i < boundary_patches; i++) {
      REIS(32, fread(patch_label, sizeof(char), 32, file), "patch_label");
      patch_label[32] = '\0';
      REIS(16, fread(patch_type, sizeof(char), 16, file), "patch_type");
      patch_type[16] = '\0';
      REIS(1, fread(&patch_id, sizeof(patch_id), 1, file), "patch_id");
      if (verbose)
        printf("%s %s %d -> %d\n", patch_label, patch_type, patch_id,
               -patch_id);
    }
    nnode = nnodes;
  }
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &dim, 1, REF_INT_TYPE), "dim");
  ref_grid_twod(ref_grid) = (2 == dim);

  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid),
                    &ref_grid_coordinate_system(ref_grid), 1, REF_INT_TYPE),
      "coordinate_system");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ref_grid_unit(ref_grid), 1,
                    REF_INT_TYPE),
      "unit");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ref_grid_reference(ref_grid, 0), 7,
                    REF_DBL_TYPE),
      "reference");

  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nnode, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ntri, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ntet, 1, REF_LONG_TYPE), "bcast");

  {
    REF_BOOL swap_endian = REF_FALSE;
    REF_INT version = 0;
    REF_BOOL twod = REF_FALSE;
    RSS(ref_part_node(file, swap_endian, version, twod, ref_node, nnode),
        "part node");
  }

  if (ref_grid_twod(ref_grid)) {
    REF_CELL ref_cell = ref_grid_edg(ref_grid);
    REF_INT version = 0;
    REF_INT cell;
    REF_BOOL pad = REF_TRUE;
    RSS(ref_part_meshb_cell(ref_cell, ntri, ref_node, nnode, version, pad,
                            file),
        "read edg as tri");
    /* positive face ids */
    each_ref_cell_valid_cell(ref_cell, cell) {
      ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell) =
          -ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
  } else {
    REF_CELL ref_cell = ref_grid_tri(ref_grid);
    REF_INT version = 0;
    REF_INT cell;
    REF_BOOL pad = REF_FALSE;
    RSS(ref_part_meshb_cell(ref_cell, ntri, ref_node, nnode, version, pad,
                            file),
        "read tri");
    /* positive face ids */
    each_ref_cell_valid_cell(ref_cell, cell) {
      ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell) =
          -ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
  }

  if (ref_grid_twod(ref_grid)) { /* use the zero pad as the faceid */
    REF_CELL ref_cell = ref_grid_tri(ref_grid);
    REF_INT version = 0;
    REF_BOOL pad = REF_FALSE;
    REF_INT cell, temp_node;
    RSS(ref_part_meshb_cell(ref_cell, ntet, ref_node, nnode, version, pad,
                            file),
        "read tri");
    /* avm winds tri different than EGADS */
    each_ref_cell_valid_cell(ref_cell, cell) {
      temp_node = ref_cell_c2n(ref_cell, 2, cell);
      ref_cell_c2n(ref_cell, 2, cell) = ref_cell_c2n(ref_cell, 1, cell);
      ref_cell_c2n(ref_cell, 1, cell) = temp_node;
    }
  } else {
    REF_FILEPOS conn_offset, faceid_offset;
    REF_BOOL swap_endian = REF_FALSE;
    REF_BOOL sixty_four_bit = REF_FALSE;
    conn_offset = 0;
    if (ref_grid_once(ref_grid)) conn_offset = ftello(file);
    faceid_offset = 0;
    RSS(ref_part_bin_ugrid_cell(ref_grid_tet(ref_grid), ntet, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "read tet");
  }

  if (ref_grid_once(ref_grid)) REIS(0, fclose(file), "close file");
  return REF_SUCCESS;
}